

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_json_check(JSContext *ctx,JSONStringifyContext *jsc,JSValue holder,JSValue val,
                     JSValue key)

{
  int64_t iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  JSValue JVar6;
  JSValue JVar7;
  int64_t iStackY_80;
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValue local_48;
  
  if ((int)val.tag == -1) {
    JVar6 = JS_GetPropertyInternal(ctx,val,0x8e,val,0);
    JVar7 = val;
    if ((int)JVar6.tag != 6) {
      iVar2 = JS_IsFunction(ctx,JVar6);
      if (iVar2 == 0) {
        JS_FreeValue(ctx,JVar6);
      }
      else {
        JVar7 = JS_CallFree(ctx,JVar6,val,1,&key);
        JS_FreeValue(ctx,val);
        val = JVar7;
        if ((int)JVar7.tag == 6) goto LAB_00128dbb;
      }
      goto LAB_00128d63;
    }
LAB_00128dbb:
    JS_FreeValue(ctx,JVar7);
    iStackY_80 = 6;
  }
  else {
LAB_00128d63:
    iVar1 = (jsc->replacer_func).tag;
    JVar7 = val;
    if ((int)iVar1 != 3) {
      local_58 = key.u;
      iStack_50 = key.tag;
      JVar7.tag = iVar1;
      JVar7.u.ptr = (jsc->replacer_func).u.ptr;
      local_48 = val;
      JVar7 = JS_Call(ctx,JVar7,holder,2,(JSValue *)&local_58);
      JS_FreeValue(ctx,val);
      if ((int)JVar7.tag == 6) goto LAB_00128dbb;
    }
    iStackY_80 = JVar7.tag;
    uVar3 = (int)JVar7.tag + 7;
    if ((uVar3 < 0xf) &&
       (((0x6381U >> (uVar3 & 0x1f) & 1) != 0 ||
        ((uVar3 == 6 && (iVar2 = JS_IsFunction(ctx,JVar7), iVar2 == 0)))))) {
      uVar5 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
      uVar4 = (ulong)JVar7.u.ptr & 0xffffffff;
      goto LAB_00128df4;
    }
    JS_FreeValue(ctx,JVar7);
    iStackY_80 = 3;
  }
  uVar4 = 0;
  uVar5 = 0;
LAB_00128df4:
  JVar6.u.ptr = (void *)(uVar4 | uVar5);
  JVar6.tag = iStackY_80;
  return JVar6;
}

Assistant:

static JSValue js_json_check(JSContext *ctx, JSONStringifyContext *jsc,
                             JSValueConst holder, JSValue val, JSValueConst key)
{
    JSValue v;
    JSValueConst args[2];

    if (JS_IsObject(val)
#ifdef CONFIG_BIGNUM
    ||  JS_IsBigInt(ctx, val)   /* XXX: probably useless */
#endif
        ) {
            JSValue f = JS_GetProperty(ctx, val, JS_ATOM_toJSON);
            if (JS_IsException(f))
                goto exception;
            if (JS_IsFunction(ctx, f)) {
                v = JS_CallFree(ctx, f, val, 1, &key);
                JS_FreeValue(ctx, val);
                val = v;
                if (JS_IsException(val))
                    goto exception;
            } else {
                JS_FreeValue(ctx, f);
            }
        }

    if (!JS_IsUndefined(jsc->replacer_func)) {
        args[0] = key;
        args[1] = val;
        v = JS_Call(ctx, jsc->replacer_func, holder, 2, args);
        JS_FreeValue(ctx, val);
        val = v;
        if (JS_IsException(val))
            goto exception;
    }

    switch (JS_VALUE_GET_NORM_TAG(val)) {
    case JS_TAG_OBJECT:
        if (JS_IsFunction(ctx, val))
            break;
    case JS_TAG_STRING:
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
#endif
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
#endif
    case JS_TAG_EXCEPTION:
        return val;
    default:
        break;
    }
    JS_FreeValue(ctx, val);
    return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}